

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O0

void Map_MappingSetupTruthTablesLarge(uint (*uTruths) [32])

{
  int local_18;
  uint local_14;
  int v;
  int m;
  uint (*uTruths_local) [32];
  
  for (local_14 = 0; (int)local_14 < 0x20; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 10; local_18 = local_18 + 1) {
      uTruths[local_18][(int)local_14] = 0;
    }
  }
  for (local_14 = 0; (int)local_14 < 0x20; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 5; local_18 = local_18 + 1) {
      if ((local_14 & 1 << ((byte)local_18 & 0x1f)) != 0) {
        uTruths[local_18][0] = 1 << ((byte)local_14 & 0x1f) | uTruths[local_18][0];
        uTruths[local_18 + 5][(int)local_14] = 0xffffffff;
      }
    }
  }
  for (local_14 = 0; (int)local_14 < 0x20; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 5; local_18 = local_18 + 1) {
      uTruths[local_18][(int)local_14] = uTruths[local_18][0];
    }
  }
  return;
}

Assistant:

void Map_MappingSetupTruthTablesLarge( unsigned uTruths[][32] )
{
    int m, v;
    // clean everything
    for ( m = 0; m < 32; m++ )
        for ( v = 0; v < 10; v++ )
            uTruths[v][m] = 0;
    // set up the truth tables
    for ( m = 0; m < 32; m++ )
        for ( v = 0; v < 5; v++ )
            if ( m & (1 << v) )
            {
                uTruths[v][0] |= (1 << m);
                uTruths[v+5][m] = MAP_FULL;
            }
    // extend this info for the rest of the first 5 variables
    for ( m = 0; m < 32; m++ )
        for ( v = 0; v < 5; v++ )
            uTruths[v][m] = uTruths[v][0];
/*
    // verify
    for ( m = 0; m < 1024; m++, printf("\n") )
        for ( v = 0; v < 10; v++ )
            if ( Map_InfoReadVar( uTruths[v], m ) )
                printf( "1" );
            else
                printf( "0" );
*/
}